

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O1

int DisconnectRPLIDAR(RPLIDAR *pRPLIDAR)

{
  byte bVar1;
  int i;
  int iVar2;
  ssize_t sVar3;
  uchar res;
  char *pcVar4;
  int i_1;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uchar reqbuf [2];
  timespec req;
  undefined4 local_30;
  short local_2c;
  timespec local_28;
  
  local_30 = CONCAT22(local_30._2_2_,0x25a5);
  iVar2 = (pRPLIDAR->RS232Port).DevType;
  if (iVar2 - 1U < 4) {
    iVar2 = (pRPLIDAR->RS232Port).s;
    uVar6 = 0;
    do {
      sVar3 = send(iVar2,(void *)((long)&local_30 + uVar6),(long)(2 - (int)uVar6),0);
      if ((int)sVar3 < 1) goto LAB_00124e6d;
      uVar5 = (int)uVar6 + (int)sVar3;
      uVar6 = (ulong)uVar5;
    } while ((int)uVar5 < 2);
  }
  else {
    if (iVar2 != 0) {
LAB_00124e6d:
      puts("Error writing data to a RPLIDAR. ");
      puts("Error while disconnecting a RPLIDAR.");
      lVar7 = 0;
      local_30 = 0x2f0a5;
      bVar1 = 0;
      do {
        bVar1 = bVar1 ^ *(byte *)((long)&local_30 + lVar7);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      local_2c = (ushort)bVar1 << 8;
      iVar2 = (pRPLIDAR->RS232Port).DevType;
      if (iVar2 - 1U < 4) {
        iVar2 = (pRPLIDAR->RS232Port).s;
        uVar6 = 0;
        do {
          sVar3 = send(iVar2,(void *)((long)&local_30 + uVar6),(long)(6 - (int)uVar6),0);
          if ((int)sVar3 < 1) goto LAB_00124f41;
          uVar5 = (int)uVar6 + (int)sVar3;
          uVar6 = (ulong)uVar5;
        } while ((int)uVar5 < 6);
      }
      else {
        if (iVar2 != 0) {
LAB_00124f41:
          puts("Error writing data to a RPLIDAR. ");
          goto LAB_00124f4d;
        }
        iVar2 = *(int *)&(pRPLIDAR->RS232Port).hDev;
        uVar6 = 0;
        do {
          sVar3 = write(iVar2,(void *)((long)&local_30 + uVar6),(ulong)(6 - (int)uVar6));
          if ((int)sVar3 < 1) goto LAB_00124f41;
          uVar5 = (int)uVar6 + (int)sVar3;
          uVar6 = (ulong)uVar5;
        } while (uVar5 < 6);
      }
      local_28.tv_sec = 0;
      local_28.tv_nsec = 500000000;
      nanosleep(&local_28,(timespec *)0x0);
LAB_00124f4d:
      CloseRS232Port(&pRPLIDAR->RS232Port);
      return 1;
    }
    iVar2 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar6 = 0;
    do {
      sVar3 = write(iVar2,(void *)((long)&local_30 + uVar6),(ulong)(2 - (int)uVar6));
      if ((int)sVar3 < 1) goto LAB_00124e6d;
      uVar5 = (int)uVar6 + (int)sVar3;
      uVar6 = (ulong)uVar5;
    } while (uVar5 < 2);
  }
  local_28.tv_sec = (long)pRPLIDAR->motordelay / 1000;
  local_28.tv_nsec = ((long)pRPLIDAR->motordelay % 1000) * 1000000;
  lVar7 = 0;
  nanosleep(&local_28,(timespec *)0x0);
  local_30 = 0x2f0a5;
  bVar1 = 0;
  do {
    bVar1 = bVar1 ^ *(byte *)((long)&local_30 + lVar7);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  local_2c = (ushort)bVar1 << 8;
  iVar2 = (pRPLIDAR->RS232Port).DevType;
  if (iVar2 - 1U < 4) {
    iVar2 = (pRPLIDAR->RS232Port).s;
    uVar6 = 0;
    do {
      sVar3 = send(iVar2,(void *)((long)&local_30 + uVar6),(long)(6 - (int)uVar6),0);
      if ((int)sVar3 < 1) goto LAB_00124fa9;
      uVar5 = (int)uVar6 + (int)sVar3;
      uVar6 = (ulong)uVar5;
    } while ((int)uVar5 < 6);
  }
  else {
    if (iVar2 != 0) {
LAB_00124fa9:
      puts("Error writing data to a RPLIDAR. ");
      goto LAB_00124fb5;
    }
    iVar2 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar6 = 0;
    do {
      sVar3 = write(iVar2,(void *)((long)&local_30 + uVar6),(ulong)(6 - (int)uVar6));
      if ((int)sVar3 < 1) goto LAB_00124fa9;
      uVar5 = (int)uVar6 + (int)sVar3;
      uVar6 = (ulong)uVar5;
    } while (uVar5 < 6);
  }
  local_28.tv_sec = 0;
  local_28.tv_nsec = 500000000;
  nanosleep(&local_28,(timespec *)0x0);
LAB_00124fb5:
  iVar2 = CloseRS232Port(&pRPLIDAR->RS232Port);
  if (iVar2 != 0) {
    puts("RPLIDAR disconnection failed.");
    return 1;
  }
  pcVar4 = " ";
  if (pRPLIDAR->SerialNumber[0] == '\0') {
    pcVar4 = "";
  }
  printf("RPLIDAR %.32s%.1sdisconnected.\n",pRPLIDAR->SerialNumber,pcVar4);
  return 0;
}

Assistant:

inline int DisconnectRPLIDAR(RPLIDAR* pRPLIDAR)
{
	if (StopRequestRPLIDAR(pRPLIDAR) != EXIT_SUCCESS)
	{
		printf("Error while disconnecting a RPLIDAR.\n");
		SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
		delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
		pRPLIDAR->drv->stopMotor();
		pRPLIDAR->drv->disconnect();
		RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
		//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
		pRPLIDAR->drv->disconnect();
		delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
		delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
		CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
		return EXIT_FAILURE;
	}

	SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
	pRPLIDAR->drv->stopMotor();
	pRPLIDAR->drv->disconnect();
	RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
	//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
	pRPLIDAR->drv->disconnect();
	delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
	delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
	if (CloseRS232Port(&pRPLIDAR->RS232Port) != EXIT_SUCCESS)
	{
		printf("RPLIDAR disconnection failed.\n");
		return EXIT_FAILURE;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	printf("RPLIDAR %.32s%.1sdisconnected.\n", pRPLIDAR->SerialNumber, (pRPLIDAR->SerialNumber[0])? " ": "\0");

	return EXIT_SUCCESS;
}